

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O3

int shm_queue_push_begin(QcShmQue *shmQue,int *idx,char **pp_buff,int *p_bufflen,QcErr *err)

{
  long lVar1;
  P_ShmQue *pPVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  undefined4 extraout_EDX;
  int cell;
  QcStaticList *staticList;
  QcStaticList *staticList_00;
  long lVar7;
  
  iVar5 = -1;
  cell = -1;
  qc_sem_wait(shmQue->sem_lst,-1);
  iVar3 = qc_staticlist_count(&shmQue->p_shmQue->lst_free);
  if (iVar3 == 0) {
    qc_seterr(err,-1,"alloc failed, no free unit in queue(%s).");
    qc_sem_post(shmQue->sem_lst);
  }
  else {
    staticList = &shmQue->p_shmQue->lst_free;
    uVar4 = qc_staticlist_get_head(staticList);
    if ((int)uVar4 < 0) {
      shm_queue_push_begin_cold_1();
      qc_sem_wait(*(QcSem **)(staticList + 1),-1);
      staticList_00 = (QcStaticList *)(*(long *)&staticList->limit + 0x144);
      iVar3 = cell;
      iVar5 = qc_staticlist_add_tail(staticList_00,cell);
      if (-1 < iVar5) {
        iVar3 = *(int *)(*(long *)&staticList->limit + 0x28);
        pcVar6 = qc_shm_getaddr(*(QcShm **)staticList);
        *(undefined4 *)
         (pcVar6 + (long)cell * ((long)iVar3 + 8) + *(long *)(*(long *)&staticList->limit + 0x15c))
             = extraout_EDX;
        qc_sem_post((QcSem *)staticList->buff_offset);
        qc_sem_post(*(QcSem **)(staticList + 1));
        return 0;
      }
      shm_queue_push_end_cold_1();
      return (int)staticList_00 + (int)staticList_00->buff_offset + iVar3 * 8;
    }
    qc_sem_post(shmQue->sem_lst);
    *idx = uVar4;
    lVar7 = (ulong)uVar4 * ((long)shmQue->p_shmQue->msg_size + 8);
    pcVar6 = qc_shm_getaddr(shmQue->qcShm);
    lVar1 = shmQue->p_shmQue->data_offset;
    *pp_buff = pcVar6 + lVar7 + lVar1;
    pPVar2 = shmQue->p_shmQue;
    *p_bufflen = pPVar2->msg_size;
    *(int *)(pcVar6 + lVar7 + lVar1) = pPVar2->msg_size;
    *pp_buff = (char *)((long)(pcVar6 + lVar7 + lVar1) + 8);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int shm_queue_push_begin(QcShmQue* shmQue, int *idx, char **pp_buff, int *p_bufflen, QcErr *err)
{
    int index;
    off_t buf_offset;

    qc_sem_wait(shmQue->sem_lst, -1);

	if (0 == qc_staticlist_count(&shmQue->p_shmQue->lst_free))
	{
		qc_seterr(err, -1, "alloc failed, no free unit in queue(%s).", shmQue->p_shmQue->quename);
        qc_sem_post(shmQue->sem_lst);
        return -1;
	}

    index = qc_staticlist_get_head(&shmQue->p_shmQue->lst_free);
	qc_assert(index>=0);

    qc_sem_post(shmQue->sem_lst);

    *idx = index;
    buf_offset = (sizeof(off_t) + shmQue->p_shmQue->msg_size) * index;
    *pp_buff = (char*)qc_shm_getaddr(shmQue->qcShm) + shmQue->p_shmQue->data_offset + buf_offset;
    *p_bufflen = shmQue->p_shmQue->msg_size;
    *((int*)*pp_buff) = shmQue->p_shmQue->msg_size;
    *pp_buff += sizeof(off_t);

    return 0;
}